

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEmbed.c
# Opt level: O2

Emb_Obj_t * Emb_ManRandomVertex(Emb_Man_t *p)

{
  int *piVar1;
  uint uVar2;
  Gia_Obj_t *pGVar3;
  
  do {
    do {
      uVar2 = Gia_ManRandom(0);
      uVar2 = (uVar2 * 0x38f) % (uint)p->pGia->nObjs;
      pGVar3 = Gia_ManObj(p->pGia,uVar2);
    } while (pGVar3->Value == 0xffffffff);
    pGVar3 = Gia_ManObj(p->pGia,uVar2);
    piVar1 = p->pObjData;
  } while ((piVar1 == (int *)0x0) ||
          ((uint)piVar1[pGVar3->Value] < 0x10 || (piVar1[pGVar3->Value] & 3U) != 0));
  return (Emb_Obj_t *)(piVar1 + pGVar3->Value);
}

Assistant:

Emb_Obj_t * Emb_ManRandomVertex( Emb_Man_t * p )
{
    Emb_Obj_t * pPivot;
    do {
        int iNode = (911 * Gia_ManRandom(0)) % Gia_ManObjNum(p->pGia);
        if ( ~Gia_ManObj(p->pGia, iNode)->Value )
            pPivot = Emb_ManObj( p, Gia_ManObj(p->pGia, iNode)->Value );
        else
            pPivot = NULL;
    }
    while ( pPivot == NULL || !Emb_ObjIsNode(pPivot) );
    return pPivot;
}